

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rect.cpp
# Opt level: O2

bool __thiscall gui::TRect::ClipStraightLine(TRect *this,TPoint *a,TPoint *b)

{
  int iVar1;
  TPoint p;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  
  p = *a;
  uVar3 = GetRegion(this,p);
  uVar4 = GetRegion(this,*b);
  bVar2 = true;
  if (uVar4 != 0 || uVar3 != 0) {
    if ((uVar4 & uVar3) == 0) {
      iVar1 = (this->p0).x;
      if (p.x < iVar1) {
        a->x = iVar1;
      }
      iVar1 = (this->p0).y;
      if (p.y < iVar1) {
        a->y = iVar1;
      }
      iVar1 = (this->p1).x;
      if (iVar1 < b->x) {
        b->x = iVar1;
      }
      iVar1 = (this->p1).y;
      if (iVar1 <= b->y) {
        b->y = iVar1;
      }
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool TRect::ClipStraightLine(TPoint &a, TPoint &b) const {
    int r0 = GetRegion(a);
    int r1 = GetRegion(b);

    // Line is in bound
    if (!(r0 | r1)) {
        return true;
    }

    // Line is invisible
    if (r0 & r1) {
        return false;
    }

    // Clip the line
    if (a.x < p0.x) {
        a.x = p0.x;
    }

    if (a.y < p0.y) {
        a.y = p0.y;
    }

    if (b.x > p1.x) {
        b.x = p1.x;
    }

    if (b.y >= p1.y) {
        b.y = p1.y;
    }

    return true;
}